

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest9::iterate(NegativeTest9 *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *pcVar3;
  char *__end;
  string vs_body;
  string local_250;
  uint local_22c;
  string local_228;
  string local_208;
  GLuint *local_1e8;
  GLuint *local_1e0;
  Functions *local_1d8;
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1d8 = (Functions *)CONCAT44(extraout_var,iVar2);
  pcVar3 = "GL_ARB_shader_subroutine";
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    local_1e0 = &this->m_vs_id;
    local_1e8 = &this->m_po_id;
    this_00 = (ostringstream *)(local_1b0 + 8);
    iVar2 = 0;
    do {
      local_1b0._0_4_ = iVar2;
      getVertexShader_abi_cxx11_
                ((string *)local_1d0,(NegativeTest9 *)pcVar3,(_test_case *)local_1b0);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1b3c1e9,0x1b3c1e9);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,0x1b3c1e9,0x1b3c1e9);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,0x1b3c1e9,0x1b3c1e9);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,0x1b3c1e9,0x1b3c1e9);
      local_22c = 0;
      pcVar3 = local_1d0;
      bVar1 = Utils::buildProgram(local_1d8,(string *)pcVar3,(string *)local_1b0,&local_250,
                                  &local_228,&local_208,(GLchar **)0x0,&local_22c,local_1e0,
                                  (GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,local_1e8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        pcVar3 = (char *)(local_208.field_2._M_allocated_capacity + 1);
        operator_delete(local_208._M_dataplus._M_p,(ulong)pcVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        pcVar3 = (char *)(local_228.field_2._M_allocated_capacity + 1);
        operator_delete(local_228._M_dataplus._M_p,(ulong)pcVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        pcVar3 = (char *)(local_250.field_2._M_allocated_capacity + 1);
        operator_delete(local_250._M_dataplus._M_p,(ulong)pcVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        pcVar3 = (char *)(local_1a0[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_1b0._0_8_,(ulong)pcVar3);
      }
      if (bVar1) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        pcVar3 = "A program object was successfully built for [";
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"A program object was successfully built for [",0x2d);
        local_228._M_dataplus._M_p._0_4_ = iVar2;
        getTestCaseString_abi_cxx11_(&local_250,(NegativeTest9 *)pcVar3,(_test_case *)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"] test case, even though it was invalid.",0x28);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = &std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(this);
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        pcVar3 = (char *)(local_1d0._16_8_ + 1);
        operator_delete((void *)local_1d0._0_8_,(ulong)pcVar3);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar1 = this->m_has_test_passed == false;
    if (bVar1) {
      pcVar3 = "Fail";
    }
    else {
      pcVar3 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,pcVar3);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult NegativeTest9::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all test cases */
	for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT); ++test_case)
	{
		/* Try to build a program object using invalid vertex shader, specific to the
		 * iteration we're currently in */
		std::string vs_body = getVertexShader(static_cast<_test_case>(test_case));

		if (ShaderSubroutine::Utils::buildProgram(gl, vs_body, "",   /* tc_body */
												  "",				 /* te_body */
												  "",				 /* gs_body */
												  "",				 /* fs_body */
												  DE_NULL,			 /* xfb_varyings */
												  0,				 /* n_xfb_varyings */
												  &m_vs_id, DE_NULL, /* out_tc_id */
												  DE_NULL,			 /* out_te_id */
												  DE_NULL,			 /* out_gs_id */
												  DE_NULL,			 /* out_fs_id */
												  &m_po_id))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A program object was successfully built for ["
							   << getTestCaseString(static_cast<_test_case>(test_case))
							   << "] test case, even though it was invalid." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Delete any objects that may have been created */
		deinit();
	} /* for (all test cases) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}